

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestSuite *pTVar1;
  pointer ppTVar2;
  TestInfo *pTVar3;
  bool bVar4;
  bool bVar5;
  pointer ppTVar6;
  byte bVar7;
  int iVar8;
  undefined4 in_register_00000034;
  string *filter;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  allocator<char> local_17d;
  int32_t local_17c;
  int32_t local_178;
  ReactionToSharding local_174;
  string local_170;
  pointer local_150;
  pointer local_148;
  string test_name;
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  
  filter = (string *)CONCAT44(in_register_00000034,shard_tests);
  local_174 = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_178 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    filter = (string *)0xffffffff;
    local_17c = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_17c = -1;
    local_178 = local_17c;
  }
  anon_unknown_38::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (&gtest_flag_filter,filter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"DISABLED_*:*/DISABLED_*",(allocator<char> *)&test_name);
  anon_unknown_38::UnitTestFilter::UnitTestFilter(&disable_test_filter,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  local_150 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  iVar10 = 0;
  iVar8 = 0;
  ppTVar6 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppTVar6 != local_150) {
    pTVar1 = *ppTVar6;
    local_148 = ppTVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,(pTVar1->name_)._M_dataplus._M_p,(allocator<char> *)&test_name);
    pTVar1->should_run_ = false;
    for (uVar9 = 0;
        ppTVar2 = (pTVar1->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(pTVar1->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
        uVar9 = uVar9 + 1) {
      pTVar3 = ppTVar2[uVar9];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test_name,(pTVar3->name_)._M_dataplus._M_p,&local_17d);
      bVar4 = anon_unknown_38::UnitTestFilter::MatchesName(&disable_test_filter,&local_170);
      bVar5 = true;
      if (!bVar4) {
        bVar5 = anon_unknown_38::UnitTestFilter::MatchesName(&disable_test_filter,&test_name);
      }
      pTVar3->is_disabled_ = bVar5;
      bVar4 = anon_unknown_38::PositiveAndNegativeUnitTestFilter::MatchesTest
                        (&gtest_flag_filter,&local_170,&test_name);
      pTVar3->matches_filter_ = bVar4;
      bVar11 = iVar8 % local_178 != local_17c;
      bVar7 = bVar4 & (bVar5 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
      pTVar3->is_in_another_shard_ = local_174 != IGNORE_SHARDING_PROTOCOL && bVar11;
      bVar4 = (bool)((local_174 == IGNORE_SHARDING_PROTOCOL || !bVar11) & bVar7);
      iVar8 = iVar8 + (uint)bVar7;
      iVar10 = iVar10 + (uint)bVar4;
      pTVar3->should_run_ = bVar4;
      pTVar1->should_run_ = (bool)(pTVar1->should_run_ | bVar4);
      std::__cxx11::string::~string((string *)&test_name);
    }
    std::__cxx11::string::~string((string *)&local_170);
    ppTVar6 = local_148 + 1;
  }
  anon_unknown_38::UnitTestFilter::~UnitTestFilter(&disable_test_filter);
  anon_unknown_38::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            (&gtest_flag_filter);
  return iVar10;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}